

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall google::protobuf::io::CodedInputStream::Refresh(CodedInputStream *this)

{
  ZeroCopyInputStream *pZVar1;
  uint8_t *__src;
  char cVar2;
  bool bVar3;
  int iVar4;
  int extraout_EDX;
  int iVar5;
  int iVar6;
  CodedInputStream *this_00;
  int iVar7;
  undefined1 *__dest;
  size_t __n;
  int buffer_size;
  void *void_buffer;
  uint local_3c;
  uint8_t *local_38;
  undefined1 local_30 [16];
  
  this_00 = (CodedInputStream *)(this->buffer_end_ + -(long)this->buffer_);
  if ((int)this_00 == 0) {
    if (((this->buffer_size_after_limit_ < 1) && (this->overflow_bytes_ < 1)) &&
       (this->total_bytes_read_ != this->current_limit_)) {
      pZVar1 = this->input_;
      do {
        iVar4 = (*pZVar1->_vptr_ZeroCopyInputStream[2])(pZVar1,&local_38,&local_3c);
        cVar2 = (char)iVar4;
        if (cVar2 == '\0') {
          this->buffer_ = (uint8_t *)0x0;
          this->buffer_end_ = (uint8_t *)0x0;
          return false;
        }
        this_00 = (CodedInputStream *)(long)(int)local_3c;
      } while (this_00 == (CodedInputStream *)0x0);
      this->buffer_ = local_38;
      local_38 = (uint8_t *)((long)&this_00->buffer_ + (long)local_38);
      this->buffer_end_ = local_38;
      if ((int)local_3c < 0) goto LAB_002a43a8;
      iVar4 = this->total_bytes_read_;
      iVar5 = iVar4 - (local_3c ^ 0x7fffffff);
      if (iVar5 == 0 || iVar4 < (int)(local_3c ^ 0x7fffffff)) {
        iVar4 = local_3c + iVar4;
      }
      else {
        this->overflow_bytes_ = iVar5;
        local_38 = local_38 + -(long)iVar5;
        iVar4 = 0x7fffffff;
      }
      this->total_bytes_read_ = iVar4;
      this->buffer_end_ = local_38 + this->buffer_size_after_limit_;
      iVar5 = this->current_limit_;
      if (this->total_bytes_limit_ < this->current_limit_) {
        iVar5 = this->total_bytes_limit_;
      }
      iVar6 = iVar4 - iVar5;
      iVar7 = 0;
      if (iVar6 != 0 && iVar5 <= iVar4) {
        this->buffer_end_ = local_38 + this->buffer_size_after_limit_ + -(long)iVar6;
        iVar7 = iVar6;
      }
      this->buffer_size_after_limit_ = iVar7;
    }
    else {
      cVar2 = '\0';
      if ((this->total_bytes_limit_ <= this->total_bytes_read_ - this->buffer_size_after_limit_) &&
         (this->total_bytes_limit_ != this->current_limit_)) {
        PrintTotalBytesLimitError(this);
        cVar2 = '\0';
      }
    }
    return (bool)cVar2;
  }
  Refresh();
LAB_002a43a8:
  __dest = local_30;
  Refresh();
  iVar4 = extraout_EDX;
  do {
    iVar5 = iVar4;
    __src = this_00->buffer_;
    iVar7 = (int)this_00->buffer_end_ - (int)__src;
    if (iVar5 - iVar7 == 0 || iVar5 < iVar7) {
      memcpy(__dest,__src,(long)iVar5);
      this_00->buffer_ = this_00->buffer_ + iVar5;
      break;
    }
    __n = (size_t)iVar7;
    memcpy(__dest,__src,__n);
    __dest = __dest + __n;
    this_00->buffer_ = this_00->buffer_ + __n;
    bVar3 = Refresh(this_00);
    iVar4 = iVar5 - iVar7;
  } while (bVar3);
  return iVar5 <= iVar7;
}

Assistant:

bool CodedInputStream::Refresh() {
  ABSL_DCHECK_EQ(0, BufferSize());

  if (buffer_size_after_limit_ > 0 || overflow_bytes_ > 0 ||
      total_bytes_read_ == current_limit_) {
    // We've hit a limit.  Stop.
    int current_position = total_bytes_read_ - buffer_size_after_limit_;

    if (current_position >= total_bytes_limit_ &&
        total_bytes_limit_ != current_limit_) {
      // Hit total_bytes_limit_.
      PrintTotalBytesLimitError();
    }

    return false;
  }

  const void* void_buffer;
  int buffer_size;
  if (NextNonEmpty(input_, &void_buffer, &buffer_size)) {
    buffer_ = reinterpret_cast<const uint8_t*>(void_buffer);
    buffer_end_ = buffer_ + buffer_size;
    ABSL_CHECK_GE(buffer_size, 0);

    if (total_bytes_read_ <= INT_MAX - buffer_size) {
      total_bytes_read_ += buffer_size;
    } else {
      // Overflow.  Reset buffer_end_ to not include the bytes beyond INT_MAX.
      // We can't get that far anyway, because total_bytes_limit_ is guaranteed
      // to be less than it.  We need to keep track of the number of bytes
      // we discarded, though, so that we can call input_->BackUp() to back
      // up over them on destruction.

      // The following line is equivalent to:
      //   overflow_bytes_ = total_bytes_read_ + buffer_size - INT_MAX;
      // except that it avoids overflows.  Signed integer overflow has
      // undefined results according to the C standard.
      overflow_bytes_ = total_bytes_read_ - (INT_MAX - buffer_size);
      buffer_end_ -= overflow_bytes_;
      total_bytes_read_ = INT_MAX;
    }

    RecomputeBufferLimits();
    return true;
  } else {
    buffer_ = NULL;
    buffer_end_ = NULL;
    return false;
  }
}